

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O0

void __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::make_fa
          (StronglyRegularToFA<covenant::Sym> *this,State q_0,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *alpha,State q_1,
          SymStateMap *SymToState)

{
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  __first;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  __first_00;
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  void *this_00;
  size_type sVar5;
  ostream *poVar6;
  const_reference pvVar7;
  value_type *pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  ulong uVar12;
  reference pvVar13;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  *p_Var14;
  StronglyRegularToFA<covenant::Sym> *in_RDX;
  long in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_R8;
  bool bVar15;
  State q_D_1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> beta_2;
  Sym D_1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS_2;
  int r_2;
  uint ri_2;
  State q_C_1;
  Sym C_1;
  uint gi_1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> GroupSyms_1;
  State q_D;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> beta_1;
  Sym D;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS_1;
  int r_1;
  uint ri_1;
  State q_C;
  Sym C;
  uint gi;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> GroupSyms;
  State q_A;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  iterator It;
  Sym A;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> gamma;
  State q_2;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> beta;
  undefined4 in_stack_fffffffffffff848;
  State in_stack_fffffffffffff84c;
  CFGConnect *in_stack_fffffffffffff850;
  undefined6 in_stack_fffffffffffff858;
  byte in_stack_fffffffffffff85e;
  undefined1 in_stack_fffffffffffff85f;
  ostream *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  iterator in_stack_fffffffffffff870;
  iterator in_stack_fffffffffffff878;
  undefined5 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff885;
  undefined1 in_stack_fffffffffffff886;
  undefined1 in_stack_fffffffffffff887;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  in_stack_fffffffffffff888;
  undefined7 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff897;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_fffffffffffff898;
  allocator *in_stack_fffffffffffff8a0;
  undefined7 in_stack_fffffffffffff8a8;
  byte in_stack_fffffffffffff8af;
  byte bVar16;
  vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  *in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  byte local_6d9;
  allocator local_429;
  string local_428 [32];
  undefined1 local_408 [40];
  Sym local_3e0;
  uint local_3dc;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_3c0;
  byte local_3a3;
  byte local_3a2;
  allocator local_3a1;
  string local_3a0 [40];
  uint local_378;
  uint local_374;
  uint local_354;
  int local_350;
  uint local_34c;
  int local_330;
  byte local_329;
  Sym *local_310;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  local_308;
  Sym *local_300;
  Sym *local_2f8;
  Sym *local_2f0;
  uint local_2e4;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_290;
  int local_278;
  uint local_274;
  int local_270;
  uint local_26c;
  Sym local_268;
  uint local_264;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_248;
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228 [36];
  int local_204;
  uint local_200;
  int local_1bc;
  uint local_1b8;
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [36];
  int local_18c;
  node_pointer local_188;
  Sym local_180;
  byte local_17b;
  byte local_17a;
  allocator local_179;
  string local_178 [64];
  uint local_138;
  uint local_134;
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [60];
  uint local_d4;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8 [45];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [35];
  byte local_55;
  byte local_42;
  allocator local_41;
  string local_40 [24];
  SymStateMap *in_stack_ffffffffffffffd8;
  StronglyRegularToFA<covenant::Sym> *this_01;
  long lVar17;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20);
  local_42 = 0;
  local_55 = 0;
  bVar15 = false;
  this_01 = in_RDX;
  lVar17 = in_RDI;
  if ((avy::AvyLogFlag & 1) != 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string(local_40,"abstraction-mkFA",&local_41);
    local_55 = 1;
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff860,
                    (key_type *)
                    CONCAT17(in_stack_fffffffffffff85f,
                             CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
    bVar15 = sVar4 != 0;
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (bVar15) {
    std::operator<<((ostream *)&std::cout,"reading word ");
    poVar6 = covenant::operator<<
                       (in_stack_fffffffffffff860,
                        (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                        CONCAT17(in_stack_fffffffffffff85f,
                                 CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
    poVar6 = std::operator<<(poVar6," with size ");
    sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                      ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX);
    this_00 = (void *)std::ostream::operator<<(poVar6,sVar5);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX);
  if (sVar5 == 0) {
    local_7a = 0;
    local_7b = 0;
    bVar15 = false;
    if ((avy::AvyLogFlag & 1) != 0) {
      std::allocator<char>::allocator();
      local_7a = 1;
      std::__cxx11::string::string(local_78,"abstraction-mkFA",&local_79);
      local_7b = 1;
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff860,
                      (key_type *)
                      CONCAT17(in_stack_fffffffffffff85f,
                               CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
      bVar15 = sVar4 != 0;
    }
    if ((local_7b & 1) != 0) {
      std::__cxx11::string::~string(local_78);
    }
    if ((local_7a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    if (bVar15) {
      std::operator<<((ostream *)&std::cout,"[make_fa] reading epsilon\n");
    }
    DFA<covenant::Sym>::eps_transition
              ((DFA<covenant::Sym> *)
               CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848),
               (State)(uint)((ulong)in_stack_fffffffffffff850 >> 0x20),
               (State)(uint)in_stack_fffffffffffff850);
  }
  else {
    sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                      ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX);
    if (sVar5 == 1) {
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX,0);
      bVar15 = Sym::isTerm((Sym *)0x22d2d1);
      if (bVar15) {
        local_aa = 0;
        local_ab = 0;
        bVar15 = false;
        if ((avy::AvyLogFlag & 1) != 0) {
          std::allocator<char>::allocator();
          local_aa = 1;
          std::__cxx11::string::string(local_a8,"abstraction-mkFA",&local_a9);
          local_ab = 1;
          sVar4 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff860,
                          (key_type *)
                          CONCAT17(in_stack_fffffffffffff85f,
                                   CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
          bVar15 = sVar4 != 0;
        }
        if ((local_ab & 1) != 0) {
          std::__cxx11::string::~string(local_a8);
        }
        if ((local_aa & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
        if (bVar15) {
          std::operator<<((ostream *)&std::cout,"[make_fa] (case A->a) reading ");
          poVar6 = covenant::operator<<
                             (in_stack_fffffffffffff860,
                              (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                              CONCAT17(in_stack_fffffffffffff85f,
                                       CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)
                                      ));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX,0);
        DFA<covenant::Sym>::transition
                  ((DFA<covenant::Sym> *)
                   CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                   (State)(uint)((ulong)in_stack_fffffffffffff8b0 >> 0x20),
                   (Sym *)in_stack_fffffffffffff8a0,(State)(uint)in_stack_fffffffffffff8b0);
        return;
      }
    }
    sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                      ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX);
    if (sVar5 < 2) {
      local_17a = 0;
      local_17b = 0;
      bVar15 = false;
      if ((avy::AvyLogFlag & 1) != 0) {
        std::allocator<char>::allocator();
        local_17a = 1;
        std::__cxx11::string::string(local_178,"abstraction-mkFA",&local_179);
        local_17b = 1;
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff860,
                        (key_type *)
                        CONCAT17(in_stack_fffffffffffff85f,
                                 CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
        bVar15 = sVar4 != 0;
      }
      if ((local_17b & 1) != 0) {
        std::__cxx11::string::~string(local_178);
      }
      if ((local_17a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
      if (bVar15) {
        std::operator<<((ostream *)&std::cout,"[make_fa] (case A->B) reading ");
        poVar6 = covenant::operator<<
                           (in_stack_fffffffffffff860,
                            (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                            CONCAT17(in_stack_fffffffffffff85f,
                                     CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)))
        ;
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      pvVar7 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                         ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX,0);
      local_180.x = pvVar7->x;
      local_18c = Sym::symID(&local_180);
      local_188 = (node_pointer)
                  boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::find((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848),
                         (key_type *)0x22dae8);
      pvVar8 = boost::unordered::iterator_detail::
               iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)0x22db16);
      pvVar9 = std::vector<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>::
               operator[]((vector<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>
                           *)(in_RDI + 0x108),(ulong)pvVar8->second);
      if (*pvVar9 == NON_REC) {
        local_1b2 = 0;
        local_1b3 = 0;
        bVar15 = false;
        if ((avy::AvyLogFlag & 1) != 0) {
          std::allocator<char>::allocator();
          local_1b2 = 1;
          std::__cxx11::string::string(local_1b0,"abstraction-mkFA",&local_1b1);
          local_1b3 = 1;
          sVar4 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff860,
                          (key_type *)
                          CONCAT17(in_stack_fffffffffffff85f,
                                   CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
          bVar15 = sVar4 != 0;
        }
        if ((local_1b3 & 1) != 0) {
          std::__cxx11::string::~string(local_1b0);
        }
        if ((local_1b2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        }
        if (bVar15) {
          std::operator<<((ostream *)&std::cout,"[make_fa] A is not recursive\n ");
        }
        local_1b8 = 0;
        while( true ) {
          uVar12 = (ulong)local_1b8;
          iVar3 = Sym::symID(&local_180);
          pvVar10 = std::
                    vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                  *)(in_RDI + 0x40),(long)iVar3);
          sVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                  size(pvVar10);
          if (sVar5 <= uVar12) break;
          iVar3 = Sym::symID(&local_180);
          pvVar10 = std::
                    vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                  *)(in_RDI + 0x40),(long)iVar3);
          pvVar11 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                    operator[](pvVar10,(ulong)local_1b8);
          local_1bc = pvVar11->rule;
          std::
          vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
          ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                        *)(in_RDI + 0x58),(long)local_1bc);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
          make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
                  in_stack_ffffffffffffffd8);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff860);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff860);
          local_1b8 = local_1b8 + 1;
        }
      }
      else {
        local_204 = local_180.x;
        local_200 = (uint)MapSymToState((StronglyRegularToFA<covenant::Sym> *)
                                        CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8
                                                ),(SymStateMap *)in_stack_fffffffffffff8a0,
                                        (Sym)(int)in_stack_fffffffffffff8b0);
        pvVar8 = boost::unordered::iterator_detail::
                 iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)0x22deaf);
        pvVar9 = std::vector<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>::
                 operator[]((vector<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>
                             *)(in_RDI + 0x108),(ulong)pvVar8->second);
        if (*pvVar9 == LEFT) {
          local_22a = 0;
          local_22b = 0;
          bVar15 = false;
          if ((avy::AvyLogFlag & 1) != 0) {
            std::allocator<char>::allocator();
            local_22a = 1;
            std::__cxx11::string::string(local_228,"abstraction-mkFA",&local_229);
            local_22b = 1;
            sVar4 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff860,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffff85f,
                                     CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)))
            ;
            bVar15 = sVar4 != 0;
          }
          if ((local_22b & 1) != 0) {
            std::__cxx11::string::~string(local_228);
          }
          if ((local_22a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_229);
          }
          if (bVar15) {
            std::operator<<((ostream *)&std::cout,"[make_fa] A is marked as LEFT\n");
          }
          boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)0x22e052);
          CFGConnect::group(in_stack_fffffffffffff850,in_stack_fffffffffffff84c.id);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff898);
          convert_ints_to_symbols
                    ((StronglyRegularToFA<covenant::Sym> *)
                     CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860);
          for (local_264 = 0; uVar12 = (ulong)local_264,
              sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_248),
              uVar12 < sVar5; local_264 = local_264 + 1) {
            pvVar13 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                                (&local_248,(ulong)local_264);
            local_270 = pvVar13->x;
            local_268.x = local_270;
            local_26c = (uint)MapSymToState((StronglyRegularToFA<covenant::Sym> *)
                                            CONCAT17(in_stack_fffffffffffff8af,
                                                     in_stack_fffffffffffff8a8),
                                            (SymStateMap *)in_stack_fffffffffffff8a0,
                                            (Sym)(int)in_stack_fffffffffffff8b0);
            local_274 = 0;
            while( true ) {
              uVar12 = (ulong)local_274;
              iVar3 = Sym::symID(&local_268);
              pvVar10 = std::
                        vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                        ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                      *)(in_RDI + 0x40),(long)iVar3);
              sVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                      ::size(pvVar10);
              if (sVar5 <= uVar12) break;
              iVar3 = Sym::symID(&local_268);
              pvVar10 = std::
                        vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                        ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                      *)(in_RDI + 0x40),(long)iVar3);
              pvVar11 = std::
                        vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                        operator[](pvVar10,(ulong)local_274);
              local_278 = pvVar11->rule;
              std::
              vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
              ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                            *)(in_RDI + 0x58),(long)local_278);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              bVar15 = intersect_unorder_ord<covenant::Sym>
                                 ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                  in_stack_fffffffffffff878._M_current,
                                  (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                  in_stack_fffffffffffff870._M_current);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              if (((bVar15 ^ 0xffU) & 1) == 0) {
                local_2f0 = (Sym *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin
                                             ((vector<covenant::Sym,_std::allocator<covenant::Sym>_>
                                               *)CONCAT44(in_stack_fffffffffffff84c.id,
                                                          in_stack_fffffffffffff848));
                local_2f8 = (Sym *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end
                                             ((vector<covenant::Sym,_std::allocator<covenant::Sym>_>
                                               *)CONCAT44(in_stack_fffffffffffff84c.id,
                                                          in_stack_fffffffffffff848));
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](&local_290,0)
                ;
                local_329 = 0;
                __first._M_current._7_1_ = in_stack_fffffffffffff897;
                __first._M_current._0_7_ = in_stack_fffffffffffff890;
                bVar15 = std::
                         binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                   (__first,in_stack_fffffffffffff888,
                                    (Sym *)CONCAT17(in_stack_fffffffffffff887,
                                                    CONCAT16(in_stack_fffffffffffff886,
                                                             CONCAT15(in_stack_fffffffffffff885,
                                                                      in_stack_fffffffffffff880))));
                local_6d9 = 0;
                if (bVar15) {
                  local_308._M_current =
                       (Sym *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin
                                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                         CONCAT44(in_stack_fffffffffffff84c.id,
                                                  in_stack_fffffffffffff848));
                  p_Var14 = __gnu_cxx::
                            __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                            ::operator++(&local_308);
                  local_300 = p_Var14->_M_current;
                  local_310 = (Sym *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end
                                               ((vector<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                 *)CONCAT44(in_stack_fffffffffffff84c.id,
                                                            in_stack_fffffffffffff848));
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  local_329 = 1;
                  bVar15 = intersect_unorder_ord<covenant::Sym>
                                     (in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                                      (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                      CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868))
                  ;
                  local_6d9 = bVar15 ^ 0xff;
                }
                if ((local_329 & 1) != 0) {
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                }
                if ((local_6d9 & 1) != 0) {
                  pvVar13 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                                      (&local_290,0);
                  local_330 = pvVar13->x;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  remove<covenant::Sym>
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             CONCAT17(in_stack_fffffffffffff887,
                                      CONCAT16(in_stack_fffffffffffff886,
                                               CONCAT15(in_stack_fffffffffffff885,
                                                        in_stack_fffffffffffff880))),
                             (size_t)in_stack_fffffffffffff878._M_current);
                  local_350 = local_330;
                  local_354 = (uint)MapSymToState((StronglyRegularToFA<covenant::Sym> *)
                                                  CONCAT17(in_stack_fffffffffffff8af,
                                                           in_stack_fffffffffffff8a8),
                                                  (SymStateMap *)in_stack_fffffffffffff8a0,
                                                  (Sym)(int)in_stack_fffffffffffff8b0);
                  local_34c = local_354;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  local_374 = local_26c;
                  make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
                          in_stack_ffffffffffffffd8);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                }
              }
              else {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                local_2e4 = local_26c;
                make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
                        in_stack_ffffffffffffffd8);
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           in_stack_fffffffffffff860);
              }
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              local_274 = local_274 + 1;
            }
          }
          local_378 = local_200;
          DFA<covenant::Sym>::eps_transition
                    ((DFA<covenant::Sym> *)
                     CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848),
                     (State)(uint)((ulong)in_stack_fffffffffffff850 >> 0x20),
                     (State)(uint)in_stack_fffffffffffff850);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff860);
        }
        else {
          local_3a2 = 0;
          local_3a3 = 0;
          bVar15 = false;
          if ((avy::AvyLogFlag & 1) != 0) {
            std::allocator<char>::allocator();
            local_3a2 = 1;
            std::__cxx11::string::string(local_3a0,"abstraction-mkFA",&local_3a1);
            local_3a3 = 1;
            sVar4 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff860,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffff85f,
                                     CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)))
            ;
            bVar15 = sVar4 != 0;
          }
          if ((local_3a3 & 1) != 0) {
            std::__cxx11::string::~string(local_3a0);
          }
          if ((local_3a2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
          }
          if (bVar15) {
            std::operator<<((ostream *)&std::cout,"[make_fa] A is marked as RIGHT/CYCLIC\n");
          }
          boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)0x22e8ef);
          CFGConnect::group(in_stack_fffffffffffff850,in_stack_fffffffffffff84c.id);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff898);
          convert_ints_to_symbols
                    ((StronglyRegularToFA<covenant::Sym> *)
                     CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860);
          for (local_3dc = 0; uVar12 = (ulong)local_3dc,
              sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_3c0),
              uVar12 < sVar5; local_3dc = local_3dc + 1) {
            pvVar13 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                                (&local_3c0,(ulong)local_3dc);
            local_408._32_4_ = pvVar13->x;
            local_3e0.x = local_408._32_4_;
            local_408._36_4_ =
                 MapSymToState((StronglyRegularToFA<covenant::Sym> *)
                               CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                               (SymStateMap *)in_stack_fffffffffffff8a0,
                               (Sym)(int)in_stack_fffffffffffff8b0);
            local_408._28_4_ = 0;
            while( true ) {
              uVar12 = (ulong)(uint)local_408._28_4_;
              iVar3 = Sym::symID(&local_3e0);
              pvVar10 = std::
                        vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                        ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                                      *)(in_RDI + 0x40),(long)iVar3);
              sVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                      ::size(pvVar10);
              if (sVar5 <= uVar12) break;
              in_stack_fffffffffffff8b0 =
                   (vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)(in_RDI + 0x40);
              iVar3 = Sym::symID(&local_3e0);
              pvVar10 = std::
                        vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                        ::operator[](in_stack_fffffffffffff8b0,(long)iVar3);
              pvVar11 = std::
                        vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                        operator[](pvVar10,(ulong)(uint)local_408._28_4_);
              local_408._24_4_ = pvVar11->rule;
              std::
              vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
              ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                            *)(in_RDI + 0x58),(long)(int)local_408._24_4_);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              bVar16 = 0;
              in_stack_fffffffffffff8af = bVar16;
              if ((avy::AvyLogFlag & 1) != 0) {
                in_stack_fffffffffffff8a0 = &local_429;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_428,"abstraction-mkFA",in_stack_fffffffffffff8a0)
                ;
                in_stack_fffffffffffff898 =
                     (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff860,
                             (key_type *)
                             CONCAT17(in_stack_fffffffffffff85f,
                                      CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858))
                            );
                bVar16 = in_stack_fffffffffffff898 !=
                         (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)0x0;
                in_stack_fffffffffffff8af = bVar16;
                std::__cxx11::string::~string(local_428);
                std::allocator<char>::~allocator((allocator<char> *)&local_429);
              }
              if ((bVar16 & 1) != 0) {
                in_stack_fffffffffffff888._M_current =
                     (Sym *)covenant::operator<<
                                      (in_stack_fffffffffffff860,
                                       (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                       CONCAT17(in_stack_fffffffffffff85f,
                                                CONCAT16(in_stack_fffffffffffff85e,
                                                         in_stack_fffffffffffff858)));
                std::operator<<((ostream *)in_stack_fffffffffffff888._M_current,"   ");
              }
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
              uVar1 = intersect_unorder_ord<covenant::Sym>
                                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                 in_stack_fffffffffffff878._M_current,
                                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                 in_stack_fffffffffffff870._M_current);
              bVar2 = uVar1 ^ 0xff;
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              if ((bVar2 & 1) == 0) {
                in_stack_fffffffffffff870._M_current = (Sym *)&local_3c0;
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848));
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848));
                in_stack_fffffffffffff878._M_current = (Sym *)local_408;
                sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                   in_stack_fffffffffffff878._M_current);
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           in_stack_fffffffffffff878._M_current,sVar5 - 1);
                __first_00._M_current._7_1_ = bVar16;
                __first_00._M_current._0_7_ = in_stack_fffffffffffff890;
                in_stack_fffffffffffff885 =
                     std::
                     binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                               (__first_00,in_stack_fffffffffffff888,
                                (Sym *)CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(
                                                  in_stack_fffffffffffff885,
                                                  in_stack_fffffffffffff880))));
                bVar16 = 0;
                if ((bool)in_stack_fffffffffffff885) {
                  in_stack_fffffffffffff860 = (ostream *)local_408;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848));
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848));
                  __gnu_cxx::
                  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                  ::operator-((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                               *)CONCAT17(in_stack_fffffffffffff85f,
                                          CONCAT16(in_stack_fffffffffffff85e,
                                                   in_stack_fffffffffffff858)),
                              (difference_type)in_stack_fffffffffffff850);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  in_stack_fffffffffffff85f =
                       intersect_unorder_ord<covenant::Sym>
                                 (in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                                  (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                  CONCAT17(bVar16,in_stack_fffffffffffff868));
                  bVar16 = in_stack_fffffffffffff85f ^ 0xff;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                }
                in_stack_fffffffffffff85e = bVar16;
                if ((in_stack_fffffffffffff85e & 1) != 0) {
                  in_stack_fffffffffffff850 = (CFGConnect *)local_408;
                  sVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                     in_stack_fffffffffffff850);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff850,sVar5 - 1);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_408);
                  remove<covenant::Sym>
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffff885,
                                                                    in_stack_fffffffffffff880))),
                             (size_t)in_stack_fffffffffffff878._M_current);
                  in_stack_fffffffffffff84c =
                       MapSymToState((StronglyRegularToFA<covenant::Sym> *)
                                     CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                                     (SymStateMap *)in_stack_fffffffffffff8a0,
                                     (Sym)(int)in_stack_fffffffffffff8b0);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                  make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
                          in_stack_ffffffffffffffd8);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                             in_stack_fffffffffffff860);
                }
              }
              else {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
                        in_stack_ffffffffffffffd8);
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                           in_stack_fffffffffffff860);
              }
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_fffffffffffff860);
              local_408._28_4_ = local_408._28_4_ + 1;
            }
          }
          DFA<covenant::Sym>::eps_transition
                    ((DFA<covenant::Sym> *)
                     CONCAT44(in_stack_fffffffffffff84c.id,in_stack_fffffffffffff848),
                     (State)(uint)((ulong)in_stack_fffffffffffff850 >> 0x20),
                     (State)(uint)in_stack_fffffffffffff850);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     in_stack_fffffffffffff860);
        }
      }
    }
    else {
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff8a0,
                 in_stack_fffffffffffff898);
      remove<covenant::Sym>
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 CONCAT17(in_stack_fffffffffffff887,
                          CONCAT16(in_stack_fffffffffffff886,
                                   CONCAT15(in_stack_fffffffffffff885,in_stack_fffffffffffff880))),
                 (size_t)in_stack_fffffffffffff878._M_current);
      DFA<covenant::Sym>::nStates((DFA<covenant::Sym> *)0x22d52c);
      local_d4 = (uint)DFA<covenant::Sym>::state
                                 ((DFA<covenant::Sym> *)
                                  CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                                  iVar3);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)0x22d567);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_RDX,0);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::push_back
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff860,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffff85f,
                          CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
      local_112 = 0;
      local_113 = 0;
      bVar15 = false;
      if ((avy::AvyLogFlag & 1) != 0) {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string(local_110,"abstraction-mkFA",&local_111);
        local_113 = 1;
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff860,
                        (key_type *)
                        CONCAT17(in_stack_fffffffffffff85f,
                                 CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)));
        bVar15 = sVar4 != 0;
      }
      if ((local_113 & 1) != 0) {
        std::__cxx11::string::~string(local_110);
      }
      if ((local_112 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      if (bVar15) {
        std::operator<<((ostream *)&std::cout,"[make_fa] (case A-> BC) reading ");
        poVar6 = covenant::operator<<
                           (in_stack_fffffffffffff860,
                            (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                            CONCAT17(in_stack_fffffffffffff85f,
                                     CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)))
        ;
        std::operator<<(poVar6," ");
        poVar6 = covenant::operator<<
                           (in_stack_fffffffffffff860,
                            (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                            CONCAT17(in_stack_fffffffffffff85f,
                                     CONCAT16(in_stack_fffffffffffff85e,in_stack_fffffffffffff858)))
        ;
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff8a0,
                 in_stack_fffffffffffff898);
      local_134 = local_d4;
      make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
              in_stack_ffffffffffffffd8);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff860)
      ;
      local_138 = local_d4;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff8a0,
                 in_stack_fffffffffffff898);
      make_fa(this_01,(State)(uint)((ulong)lVar17 >> 0x20),in_R8,(State)(uint)lVar17,
              in_stack_ffffffffffffffd8);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff860)
      ;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff860)
      ;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffff860)
      ;
    }
  }
  return;
}

Assistant:

void make_fa(const State q_0, 
               const vector<EdgeSym> alpha, 
               const State q_1, 
               SymStateMap &SymToState) 
  {

    LOG ("abstraction-mkFA", 
         cout << "reading word " << alpha 
         << " with size " << alpha.size() << endl);

    if (alpha.size() == 0)
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] reading epsilon\n");

      dfa.eps_transition(q_0,q_1);
      return;
    }
    else if (alpha.size () == 1 && alpha[0].isTerm ())
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->a) reading " << alpha << endl);

      dfa.transition(q_0, alpha[0], q_1);
      return;
    }
    else if (alpha.size() >= 2)
    {
      vector<EdgeSym> beta(alpha);
      remove(beta,0);
      State q_2 = dfa.state(dfa.nStates());
      vector<EdgeSym> gamma;
      gamma.push_back(alpha[0]);

      LOG ("abstraction-mkFA",
           cout << "[make_fa] (case A-> BC) reading " << gamma << " " 
           << beta << endl);

      make_fa(q_0, gamma, q_2, SymToState);
      make_fa(q_2, beta , q_1, SymToState);
      return;
    }
    else
    {
      //assert(alpha.size() == 1 && isVar(alpha[0]));

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->B) reading " << alpha << endl);

      EdgeSym A =  alpha[0];	
      SymSCCMap::iterator It = sym_scc_map.find(A.symID ());
      if (recursive[(*It).second] == NON_REC)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is not recursive\n ");

        for ( unsigned int ri = 0; ri < g.prods[A.symID()].size(); ri++ )
        {
          int r = g.prods[A.symID ()][ri].rule;
          vector<EdgeSym> RHS = g.rules[r];
          make_fa(q_0, RHS, q_1, SymToState);
        }
        return;
      }
        
      State q_A = MapSymToState(SymToState, A);
      if (recursive[(*It).second] == LEFT)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as LEFT\n");

        // GroupSyms must be sorted
        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];
              
            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_0, RHS, q_C, SymToState);
            else{
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[0]) &&
                  (!intersect_unorder_ord(++RHS.begin(), RHS.end(), GroupSyms)))
              {
                EdgeSym D = RHS[0];
                vector<EdgeSym> beta(RHS);
                remove(beta,0);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_D, beta, q_C, SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_A,q_1);
      } // end LEFT
      else
      {
        /////
        // RIGHT or CYCLIC: code almost identical
        /////

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as RIGHT/CYCLIC\n"); 

        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];

            LOG ("abstraction-mkFA", cout << RHS << "   " );

            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_C, RHS, q_1, SymToState);
            else
            {
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[RHS.size()-1]) &&
                  (!intersect_unorder_ord(RHS.begin(), RHS.end()-1, GroupSyms)))
              {
                EdgeSym D = RHS[RHS.size()-1];
                vector<EdgeSym> beta(RHS);
                remove(beta,RHS.size()-1);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_C, beta, q_D,  SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_0,q_A);
      } // end RIGHT or CYCLIC	
      return;
    }
  }